

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  int iVar1;
  EnumOptions *pEVar2;
  EnumValueDescriptor *enum_value;
  EnumDescriptor *in_RSI;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_1c;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    pEVar2 = EnumOptions::default_instance();
    *(EnumOptions **)(in_RSI + 0x20) = pEVar2;
  }
  local_1c = 0;
  while( true ) {
    iVar3 = local_1c;
    iVar1 = EnumDescriptor::value_count(in_RSI);
    if (iVar1 <= iVar3) break;
    enum_value = (EnumValueDescriptor *)(*(long *)(in_RSI + 0x30) + (long)local_1c * 0x28);
    EnumDescriptorProto::value
              ((EnumDescriptorProto *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
               (int)((ulong)enum_value >> 0x20));
    CrossLinkEnumValue((DescriptorBuilder *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),enum_value,
                       (EnumValueDescriptorProto *)0x4ac9b6);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(EnumDescriptor* enum_type,
                                      const EnumDescriptorProto& proto) {
  if (enum_type->options_ == nullptr) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}